

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

uint64_t __thiscall
duckdb::ParquetReader::GetGroupSpan(ParquetReader *this,ParquetReaderScanState *state)

{
  bool bVar1;
  reference pCVar2;
  unsigned_long a;
  idx_t current_min_offset;
  ColumnChunk *column_chunk;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb_parquet::ColumnChunk,_true> *__range1;
  idx_t max_offset;
  idx_t min_offset;
  ParquetRowGroup *group;
  vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
  *in_stack_ffffffffffffffb0;
  ParquetReaderScanState *in_stack_ffffffffffffffb8;
  ParquetReader *in_stack_ffffffffffffffc0;
  __normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
  local_38;
  vector<duckdb_parquet::ColumnChunk,_true> *local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  ParquetRowGroup *local_18;
  
  local_18 = GetGroup(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_20 = NumericLimits<unsigned_long>::Maximum();
  local_28 = NumericLimits<unsigned_long>::Minimum();
  local_30 = &local_18->columns;
  local_38._M_current =
       (ColumnChunk *)
       std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::begin
                 (in_stack_ffffffffffffffa8);
  std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
             ::operator*(&local_38);
    a = NumericLimits<unsigned_long>::Maximum();
    if (((byte)(pCVar2->meta_data).__isset >> 2 & 1) != 0) {
      a = MinValue<unsigned_long>(a,(pCVar2->meta_data).dictionary_page_offset);
    }
    if (((byte)(pCVar2->meta_data).__isset >> 1 & 1) != 0) {
      a = MinValue<unsigned_long>(a,(pCVar2->meta_data).index_page_offset);
    }
    in_stack_ffffffffffffffb0 =
         (__normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
          *)MinValue<unsigned_long>(a,(pCVar2->meta_data).data_page_offset);
    local_20 = MinValue<unsigned_long>((unsigned_long)in_stack_ffffffffffffffb0,local_20);
    local_28 = MaxValue<unsigned_long>
                         (local_28,(long)&in_stack_ffffffffffffffb0->_M_current +
                                   (pCVar2->meta_data).total_compressed_size);
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
    ::operator++(&local_38);
  }
  return local_28 - local_20;
}

Assistant:

uint64_t ParquetReader::GetGroupSpan(ParquetReaderScanState &state) {
	auto &group = GetGroup(state);
	idx_t min_offset = NumericLimits<idx_t>::Maximum();
	idx_t max_offset = NumericLimits<idx_t>::Minimum();

	for (auto &column_chunk : group.columns) {

		// Set the min offset
		idx_t current_min_offset = NumericLimits<idx_t>::Maximum();
		if (column_chunk.meta_data.__isset.dictionary_page_offset) {
			current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.dictionary_page_offset);
		}
		if (column_chunk.meta_data.__isset.index_page_offset) {
			current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.index_page_offset);
		}
		current_min_offset = MinValue<idx_t>(current_min_offset, column_chunk.meta_data.data_page_offset);
		min_offset = MinValue<idx_t>(current_min_offset, min_offset);
		max_offset = MaxValue<idx_t>(max_offset, column_chunk.meta_data.total_compressed_size + current_min_offset);
	}

	return max_offset - min_offset;
}